

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

unsigned_long __thiscall
gmlc::utilities::strViewToInteger<unsigned_long>
          (utilities *this,string_view input,size_t *charactersUsed)

{
  unsigned_long uVar1;
  invalid_argument *this_00;
  char cVar2;
  size_t *charactersUsed_00;
  code *pcVar3;
  undefined *puVar4;
  utilities *puVar5;
  char *__first;
  string_view input_00;
  __integer_from_chars_result_type<unsigned_long> _Var6;
  unsigned_long val;
  
  input_00._M_str = (long *)input._M_str;
  __first = (char *)input._M_len;
  val = 0;
  if (input_00._M_str != (long *)0x0) {
    *input_00._M_str = 0;
  }
  puVar5 = (utilities *)0x0;
  if ((utilities *)0x1 < this) {
    do {
      if (__first[(long)puVar5] != ' ') {
        if ((__first[(long)puVar5] != '0') || ((byte)((__first + 1)[(long)puVar5] | 0x20U) == 0x78))
        goto LAB_0028171a;
        cVar2 = '0';
        goto LAB_0028177f;
      }
      puVar5 = puVar5 + 1;
    } while (this != puVar5);
LAB_002816fb:
    if (input_00._M_str != (long *)0x0) {
      *input_00._M_str = (long)this;
    }
    return 0;
  }
LAB_00281720:
  charactersUsed_00 = (size_t *)0xa;
  _Var6 = CLI::std::from_chars<unsigned_long>(__first,__first + (long)this,&val,10);
  if (_Var6.ec == 0) {
    if (input_00._M_str != (long *)0x0) {
      *input_00._M_str = (long)(_Var6.ptr + ((long)puVar5 - (long)__first));
    }
    return val;
  }
  if (_Var6.ec == result_out_of_range) {
    if (input_00._M_str != (long *)0x0) {
      *input_00._M_str = (long)_Var6.ptr - (long)__first;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              ((out_of_range *)this_00,"conversion type does not support the string conversion");
    puVar4 = &std::out_of_range::typeinfo;
    pcVar3 = std::out_of_range::~out_of_range;
  }
  else {
    if (((utilities *)0x1 < this) && (*__first == '-')) {
      input_00._M_len = (size_t)__first;
      uVar1 = strViewToInteger<long>(this,input_00,charactersUsed_00);
      return uVar1;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unable to convert string");
    puVar4 = &std::invalid_argument::typeinfo;
    pcVar3 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar4,pcVar3);
LAB_0028177f:
  if (cVar2 != '0') goto LAB_0028171a;
  if (this + -1 == puVar5) goto LAB_002816fb;
  cVar2 = (__first + 1)[(long)puVar5];
  puVar5 = puVar5 + 1;
  goto LAB_0028177f;
LAB_0028171a:
  __first = __first + (long)puVar5;
  this = this + -(long)puVar5;
  goto LAB_00281720;
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}